

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall
QPDFObjectHandle::addPageContents(QPDFObjectHandle *this,QPDFObjectHandle *new_contents,bool first)

{
  undefined7 in_register_00000011;
  QPDFObjectHandle *iter;
  _Alloc_hider __x;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> content_streams;
  allocator<char> local_79;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_78;
  string local_60;
  QPDFObjectHandle local_40;
  
  assertStream(new_contents);
  local_78.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)CONCAT71(in_register_00000011,first) != 0) {
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
              (&local_78,new_contents);
  }
  getPageContents((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_60,this);
  for (__x._M_p = local_60._M_dataplus._M_p; __x._M_p != (pointer)local_60._M_string_length;
      __x._M_p = __x._M_p + 0x10) {
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
              (&local_78,(value_type *)__x._M_p);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_60);
  if (!first) {
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
              (&local_78,new_contents);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"/Contents",&local_79);
  newArray(&local_40,&local_78);
  replaceKey(this,&local_60,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_60);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_78);
  return;
}

Assistant:

void
QPDFObjectHandle::addPageContents(QPDFObjectHandle new_contents, bool first)
{
    new_contents.assertStream();

    std::vector<QPDFObjectHandle> content_streams;
    if (first) {
        QTC::TC("qpdf", "QPDFObjectHandle prepend page contents");
        content_streams.push_back(new_contents);
    }
    for (auto const& iter: getPageContents()) {
        QTC::TC("qpdf", "QPDFObjectHandle append page contents");
        content_streams.push_back(iter);
    }
    if (!first) {
        content_streams.push_back(new_contents);
    }

    this->replaceKey("/Contents", newArray(content_streams));
}